

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::sanityCheckModules(Program *program)

{
  bool bVar1;
  __optional_eq_t<unsigned_int,_int> _Var2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  reference this_00;
  Module *pMVar3;
  ProcessorInstance *pPVar4;
  ProcessorInstance *pPVar5;
  Module *pMVar6;
  InputDeclaration *pIVar7;
  size_type sVar8;
  OutputDeclaration *pOVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_02;
  char (*args_03) [27];
  char (*args_04) [28];
  __optional_gt_t<unsigned_int,_unsigned_long> local_452;
  __optional_gt_t<unsigned_int,_unsigned_long> local_3ea;
  CompileMessage local_380;
  reference local_348;
  pool_ref<soul::heart::OutputDeclaration> *output;
  iterator __end2_2;
  iterator __begin2_2;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *__range2_2;
  CompileMessage local_2f0;
  reference local_2b8;
  pool_ref<soul::heart::InputDeclaration> *input;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  *__range2_1;
  Module *mainProcessor;
  reference local_258;
  pool_ref<soul::heart::ProcessorInstance> *processorInstance;
  iterator __end3_2;
  iterator __begin3_2;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  processorInstanceNames;
  CompileMessage local_1e8;
  int local_1ac;
  CompileMessage local_1a8;
  string *local_170;
  string *name_1;
  pool_ref<soul::heart::OutputDeclaration> *o;
  iterator __end3_1;
  iterator __begin3_1;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *__range3_1;
  int local_10c;
  CompileMessage local_108;
  string *local_d0;
  string *name;
  pool_ref<soul::heart::InputDeclaration> *i;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ioNames;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moduleNames;
  Program *program_local;
  
  moduleNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)program;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  this = Program::getModules((Program *)
                             moduleNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      pMVar6 = Program::getMainProcessor
                         ((Program *)
                          moduleNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2_1 = std::
                 vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                 ::begin(&pMVar6->inputs);
      input = (pool_ref<soul::heart::InputDeclaration> *)
              std::
              vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
              ::end(&pMVar6->inputs);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
                            *)&input);
        if (!bVar1) {
          __end2_2 = std::
                     vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                     ::begin(&pMVar6->outputs);
          output = (pool_ref<soul::heart::OutputDeclaration> *)
                   std::
                   vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                   ::end(&pMVar6->outputs);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end2_2,
                               (__normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                                *)&output);
            if (!bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2);
              return;
            }
            local_348 = __gnu_cxx::
                        __normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                        ::operator*(&__end2_2);
            pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->(local_348);
            bVar1 = std::optional<unsigned_int>::has_value(&(pOVar9->super_IODeclaration).arraySize)
            ;
            if (bVar1) break;
            __gnu_cxx::
            __normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
            ::operator++(&__end2_2);
          }
          pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->(local_348);
          Errors::notYetImplemented<char_const(&)[28]>
                    (&local_380,(Errors *)"top-level arrays of outputs",args_04);
          CodeLocation::throwError(&(pOVar9->super_IODeclaration).super_Object.location,&local_380);
        }
        local_2b8 = __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
                    ::operator*(&__end2_1);
        pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->(local_2b8);
        bVar1 = std::optional<unsigned_int>::has_value(&(pIVar7->super_IODeclaration).arraySize);
        if (bVar1) break;
        pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->(local_2b8);
        sVar8 = std::vector<soul::Type,_std::allocator<soul::Type>_>::size
                          (&(pIVar7->super_IODeclaration).dataTypes);
        if (sVar8 != 1) {
          pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->(local_2b8);
          Errors::onlyOneTypeInTopLevelInputs<>();
          CodeLocation::throwError
                    (&(pIVar7->super_IODeclaration).super_Object.location,
                     (CompileMessage *)&__range2_2);
        }
        __gnu_cxx::
        __normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
        ::operator++(&__end2_1);
      }
      pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->(local_2b8);
      Errors::notYetImplemented<char_const(&)[27]>
                (&local_2f0,(Errors *)"top-level arrays of inputs",args_03);
      CodeLocation::throwError(&(pIVar7->super_IODeclaration).super_Object.location,&local_2f0);
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
              ::operator*(&__end2);
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    bVar1 = appendIfNotPresent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2,&pMVar6->fullName);
    if (!bVar1) {
      pMVar6 = pool_ref<soul::Module>::operator->(this_00);
      pMVar3 = pool_ref<soul::Module>::operator->(this_00);
      Errors::duplicateModule<std::__cxx11::string&>
                ((CompileMessage *)
                 &ioNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Errors *)&pMVar3->fullName,
                 args);
      CodeLocation::throwError
                (&pMVar6->location,
                 (CompileMessage *)
                 &ioNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    __end3 = std::
             vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
             ::begin(&pMVar6->inputs);
    i = (pool_ref<soul::heart::InputDeclaration> *)
        std::
        vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
        ::end(&pMVar6->inputs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
                                       *)&i), bVar1) {
      name = (string *)
             __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
             ::operator*(&__end3);
      pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                         ((pool_ref<soul::heart::InputDeclaration> *)name);
      local_d0 = Identifier::toString_abi_cxx11_(&(pIVar7->super_IODeclaration).name);
      bVar1 = appendIfNotPresent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3,local_d0);
      if (!bVar1) {
        pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                           ((pool_ref<soul::heart::InputDeclaration> *)name);
        Errors::nameInUse<std::__cxx11::string_const&>(&local_108,(Errors *)local_d0,args_00);
        CodeLocation::throwError(&(pIVar7->super_IODeclaration).super_Object.location,&local_108);
      }
      pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                         ((pool_ref<soul::heart::InputDeclaration> *)name);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)&(pIVar7->super_IODeclaration).arraySize);
      if (bVar1) {
        pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                           ((pool_ref<soul::heart::InputDeclaration> *)name);
        local_10c = 0;
        _Var2 = std::operator==(&(pIVar7->super_IODeclaration).arraySize,&local_10c);
        local_3ea = true;
        if (!_Var2) {
          pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                             ((pool_ref<soul::heart::InputDeclaration> *)name);
          local_3ea = std::operator>(&(pIVar7->super_IODeclaration).arraySize,
                                     &AST::maxProcessorArraySize);
        }
        if (local_3ea != false) {
          pIVar7 = pool_ref<soul::heart::InputDeclaration>::operator->
                             ((pool_ref<soul::heart::InputDeclaration> *)name);
          Errors::illegalArraySize<>();
          CodeLocation::throwError
                    (&(pIVar7->super_IODeclaration).super_Object.location,
                     (CompileMessage *)&__range3_1);
        }
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::InputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>_>
      ::operator++(&__end3);
    }
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    __end3_1 = std::
               vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
               ::begin(&pMVar6->outputs);
    o = (pool_ref<soul::heart::OutputDeclaration> *)
        std::
        vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
        ::end(&pMVar6->outputs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                               *)&o), bVar1) {
      name_1 = (string *)
               __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
               ::operator*(&__end3_1);
      pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                         ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
      local_170 = Identifier::toString_abi_cxx11_(&(pOVar9->super_IODeclaration).name);
      bVar1 = appendIfNotPresent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3,local_170);
      if (!bVar1) {
        pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                           ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
        Errors::nameInUse<std::__cxx11::string_const&>(&local_1a8,(Errors *)local_170,args_01);
        CodeLocation::throwError(&(pOVar9->super_IODeclaration).super_Object.location,&local_1a8);
      }
      pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                         ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)&(pOVar9->super_IODeclaration).arraySize);
      if (bVar1) {
        pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                           ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
        local_1ac = 0;
        _Var2 = std::operator==(&(pOVar9->super_IODeclaration).arraySize,&local_1ac);
        local_452 = true;
        if (!_Var2) {
          pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                             ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
          local_452 = std::operator>(&(pOVar9->super_IODeclaration).arraySize,
                                     &AST::maxProcessorArraySize);
        }
        if (local_452 != false) {
          pOVar9 = pool_ref<soul::heart::OutputDeclaration>::operator->
                             ((pool_ref<soul::heart::OutputDeclaration> *)name_1);
          Errors::illegalArraySize<>();
          CodeLocation::throwError(&(pOVar9->super_IODeclaration).super_Object.location,&local_1e8);
        }
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
      ::operator++(&__end3_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    bVar1 = Module::isProcessor(pMVar6);
    if (bVar1) {
LAB_0047a826:
      pMVar6 = pool_ref<soul::Module>::operator->(this_00);
      bVar1 = std::
              vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
              ::empty(&pMVar6->outputs);
      if (bVar1) {
        pMVar6 = pool_ref<soul::Module>::operator->(this_00);
        Errors::processorNeedsAnOutput<>();
        CodeLocation::throwError
                  (&pMVar6->location,
                   (CompileMessage *)
                   &processorInstanceNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      pMVar6 = pool_ref<soul::Module>::operator->(this_00);
      bVar1 = Module::isGraph(pMVar6);
      if (bVar1) goto LAB_0047a826;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3_2);
    pMVar6 = pool_ref<soul::Module>::operator->(this_00);
    __end3_2 = std::
               vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
               ::begin(&pMVar6->processorInstances);
    processorInstance =
         (pool_ref<soul::heart::ProcessorInstance> *)
         std::
         vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
         ::end(&pMVar6->processorInstances);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                               *)&processorInstance), bVar1) {
      local_258 = __gnu_cxx::
                  __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                  ::operator*(&__end3_2);
      pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(local_258);
      bVar1 = appendIfNotPresent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3_2,&pPVar4->instanceName);
      if (!bVar1) {
        pPVar4 = pool_ref<soul::heart::ProcessorInstance>::operator->(local_258);
        pPVar5 = pool_ref<soul::heart::ProcessorInstance>::operator->(local_258);
        Errors::duplicateProcessor<std::__cxx11::string&>
                  ((CompileMessage *)&mainProcessor,(Errors *)&pPVar5->instanceName,args_02);
        CodeLocation::throwError(&(pPVar4->super_Object).location,(CompileMessage *)&mainProcessor);
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
      ::operator++(&__end3_2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3_2);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void sanityCheckModules (const Program& program)
    {
        std::vector<std::string> moduleNames;

        for (auto& m : program.getModules())
        {
            if (! appendIfNotPresent (moduleNames, m->fullName))
                m->location.throwError (Errors::duplicateModule (m->fullName));

            {
                std::vector<std::string> ioNames;

                for (auto& i : m->inputs)
                {
                    auto& name = i->name.toString();

                    if (! appendIfNotPresent (ioNames, name))
                        i->location.throwError (Errors::nameInUse (name));

                    if (i->arraySize)
                    {
                        if (i->arraySize == 0 || i->arraySize > AST::maxProcessorArraySize)
                            i->location.throwError (Errors::illegalArraySize());
                    }
                }

                for (auto& o : m->outputs)
                {
                    auto& name = o->name.toString();

                    if (! appendIfNotPresent (ioNames, name))
                        o->location.throwError (Errors::nameInUse (name));

                    if (o->arraySize)
                    {
                        if (o->arraySize == 0 || o->arraySize > AST::maxProcessorArraySize)
                            o->location.throwError (Errors::illegalArraySize());
                    }
                }
            }

            if (m->isProcessor() || m->isGraph())
                if (m->outputs.empty())
                    m->location.throwError (Errors::processorNeedsAnOutput());

            {
                std::vector<std::string> processorInstanceNames;

                for (auto& processorInstance : m->processorInstances)
                    if (! appendIfNotPresent (processorInstanceNames, processorInstance->instanceName))
                        processorInstance->location.throwError (Errors::duplicateProcessor (processorInstance->instanceName));
            }
        }

        auto& mainProcessor = program.getMainProcessor();

        for (auto& input : mainProcessor.inputs)
        {
            if (input->arraySize.has_value())
                input->location.throwError (Errors::notYetImplemented ("top-level arrays of inputs"));

            if (input->dataTypes.size() != 1)
                input->location.throwError (Errors::onlyOneTypeInTopLevelInputs());
        }

        for (auto& output : mainProcessor.outputs)
            if (output->arraySize.has_value())
                output->location.throwError (Errors::notYetImplemented ("top-level arrays of outputs"));
    }